

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_svg.hpp
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> *
perior::to_svg<char,std::char_traits<char>,perior::point<double,2ul>>
          (basic_ostream<char,_std::char_traits<char>_> *os,
          rectangle<perior::point<double,_2UL>_> *box,
          cubic_periodic_boundary<perior::point<double,_2UL>_> *b,string *stroke,size_t stroke_width
          ,string *fill)

{
  double dVar1;
  double dVar2;
  double dVar3;
  pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> *ppVar4;
  pointer ppVar5;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  string *psVar7;
  double *extraout_RAX;
  double *pdVar8;
  undefined8 uVar9;
  ostream *poVar10;
  double *pdVar11;
  bool bVar12;
  bool bVar13;
  double *pdVar14;
  long lVar15;
  long lVar16;
  point<double,_2UL> *xy;
  long lVar17;
  ulong uVar18;
  pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> *ppVar19;
  vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
  boxes;
  point<double,_2UL> lower;
  pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> bx;
  point<double,_2UL> upper;
  pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> splitted;
  vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
  local_128;
  undefined1 local_108 [24];
  basic_ostream<char,_std::char_traits<char>_> *local_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> local_c8;
  string *local_a0;
  size_t local_98;
  string *local_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  undefined1 local_68 [8];
  double dStack_60;
  pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> local_58;
  
  local_108._8_8_ = local_108._0_8_;
  local_128.
  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> *)0x0;
  local_128.
  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> *)0x0;
  local_128.
  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> *)0x0;
  local_98 = stroke_width;
  local_90 = stroke;
  std::
  vector<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
  ::reserve(&local_128,4);
  pdVar8 = &dStack_70;
  dVar1 = (box->center).values_.elems[1] - (box->radius).values_.elems[1];
  unique0x1000024e = SUB84(dVar1,0);
  local_68 = (undefined1  [8])((box->center).values_.elems[0] - (box->radius).values_.elems[0]);
  unique0x10000252 = (int)((ulong)dVar1 >> 0x20);
  lVar15 = 0;
  pdVar11 = (double *)local_68;
  bVar13 = true;
  do {
    bVar12 = bVar13;
    dVar1 = *pdVar11;
    if ((b->lower_).values_.elems[lVar15] <= dVar1) {
      if ((b->upper_).values_.elems[lVar15] <= dVar1) {
        dVar1 = dVar1 - (b->width_).values_.elems[lVar15];
        goto LAB_00107905;
      }
    }
    else {
      dVar1 = dVar1 + (b->width_).values_.elems[lVar15];
LAB_00107905:
      *pdVar11 = dVar1;
    }
    lVar15 = 1;
    pdVar11 = (double *)(local_68 + 8);
    bVar13 = false;
  } while (bVar12);
  local_e8 = (double)local_68;
  dStack_e0 = dStack_60;
  local_88 = (box->radius).values_.elems[0] + (box->center).values_.elems[0];
  dStack_80 = (box->radius).values_.elems[1] + (box->center).values_.elems[1];
  lVar15 = 0;
  pdVar11 = &local_88;
  bVar13 = true;
  do {
    dVar1 = *pdVar11;
    if ((b->lower_).values_.elems[lVar15] <= dVar1) {
      if ((b->upper_).values_.elems[lVar15] <= dVar1) {
        dVar1 = dVar1 - (b->width_).values_.elems[lVar15];
        goto LAB_0010797b;
      }
    }
    else {
      dVar1 = dVar1 + (b->width_).values_.elems[lVar15];
LAB_0010797b:
      *pdVar11 = dVar1;
    }
    lVar15 = 1;
    bVar12 = !bVar13;
    pdVar11 = &dStack_80;
    bVar13 = false;
    if (bVar12) {
      local_78 = local_88;
      dStack_70 = dStack_80;
      lVar15 = 0;
      pdVar11 = &local_78;
      pdVar14 = &local_e8;
      bVar13 = true;
      do {
        bVar12 = bVar13;
        if ((b->half_width_).values_.elems[lVar15] <= (box->radius).values_.elems[lVar15]) {
          *pdVar14 = (b->lower_).values_.elems[lVar15];
          *pdVar11 = (b->upper_).values_.elems[lVar15];
        }
        lVar15 = 1;
        pdVar11 = pdVar8;
        pdVar14 = &dStack_e0;
        bVar13 = false;
      } while (bVar12);
      local_c8.first.values_.elems[0] = local_e8;
      local_c8.first.values_.elems[1] = dStack_e0;
      local_c8.second.values_.elems[0] = local_78;
      local_c8.second.values_.elems[1] = dStack_70;
      local_108._0_8_ = b;
      local_f0 = os;
      local_a0 = fill;
      if (local_128.
          super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_128.
          super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>,std::allocator<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>>>
        ::_M_realloc_insert<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>>
                  ((vector<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>,std::allocator<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>>>
                    *)&local_128,
                   (iterator)
                   local_128.
                   super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_c8);
        pdVar8 = extraout_RAX;
      }
      else {
        ((local_128.
          super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->first).values_.elems[0] = local_e8;
        ((local_128.
          super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->first).values_.elems[1] = dStack_e0;
        ((local_128.
          super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->second).values_.elems[0] = local_78;
        ((local_128.
          super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->second).values_.elems[1] = dStack_70;
        local_128.
        super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_128.
             super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      ppVar19 = &local_c8;
      uVar9 = CONCAT71((int7)((ulong)pdVar8 >> 8),1);
      lVar15 = 0;
      do {
        local_d8 = (double)CONCAT44(local_d8._4_4_,(int)uVar9);
        if ((long)local_128.
                  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_128.
                  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0) {
          lVar16 = (long)local_128.
                         super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_128.
                         super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          lVar17 = 0x10;
          uVar18 = 0;
          do {
            if ((ulong)((long)local_128.
                              super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_128.
                              super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar18) {
              uVar9 = std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,uVar18);
              if (local_128.
                  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> *)0x0) {
                operator_delete(local_128.
                                super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              _Unwind_Resume(uVar9);
            }
            pdVar8 = (double *)
                     ((long)(&(local_128.
                               super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->first + -1) + lVar17);
            dVar2 = *pdVar8;
            dVar3 = pdVar8[1];
            local_c8.first.values_.elems[0] = dVar2;
            local_c8.first.values_.elems[1] = dVar3;
            pdVar8 = (double *)
                     ((long)((local_128.
                              super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->first).values_.elems +
                     lVar17);
            local_c8.second.values_.elems[0] = *pdVar8;
            local_c8.second.values_.elems[1] = pdVar8[1];
            dVar1 = (ppVar19->first).values_.elems[0];
            pdVar8 = (double *)((long)&local_c8.second.values_ + lVar15 * 8);
            if (*pdVar8 <= dVar1 && dVar1 != *pdVar8) {
              pdVar8 = (double *)
                       ((long)((local_128.
                                super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->first).values_.elems +
                       lVar17);
              (ppVar19->first).values_.elems[0] = *(undefined8 *)(local_108._0_8_ + lVar15 * 8);
              local_58.second.values_.elems[0] = local_c8.second.values_.elems[0];
              local_58.second.values_.elems[1] = local_c8.second.values_.elems[1];
              local_58.second.values_.elems[lVar15] =
                   *(double *)(local_108._0_8_ + 0x10 + lVar15 * 8);
              *(double *)
               ((long)(&(local_128.
                         super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->first + -1) + lVar17) =
                   local_c8.first.values_.elems[0];
              *(double *)
               ((long)((local_128.
                        super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first).values_.elems +
               lVar17 + -8) = local_c8.first.values_.elems[1];
              *pdVar8 = local_c8.second.values_.elems[0];
              pdVar8[1] = local_c8.second.values_.elems[1];
              local_58.first.values_.elems[0] = dVar2;
              local_58.first.values_.elems[1] = dVar3;
              if (local_128.
                  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_128.
                  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>,std::allocator<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>>>
                ::
                _M_realloc_insert<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>const&>
                          ((vector<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>,std::allocator<std::pair<perior::point<double,2ul>,perior::point<double,2ul>>>>
                            *)&local_128,
                           (iterator)
                           local_128.
                           super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_58);
              }
              else {
                ((local_128.
                  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->first).values_.elems[0] = dVar2;
                ((local_128.
                  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->first).values_.elems[1] = dVar3;
                ((local_128.
                  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->second).values_.elems[0] =
                     local_58.second.values_.elems[0];
                ((local_128.
                  super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->second).values_.elems[1] =
                     local_58.second.values_.elems[1];
                local_128.
                super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_128.
                     super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            uVar18 = uVar18 + 1;
            lVar17 = lVar17 + 0x20;
          } while (lVar16 + (ulong)(lVar16 == 0) != uVar18);
        }
        psVar7 = local_a0;
        pbVar6 = local_f0;
        ppVar5 = local_128.
                 super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        lVar15 = 1;
        ppVar19 = (pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> *)
                  ((long)&local_c8.first.values_ + 8);
        uVar9 = 0;
        ppVar4 = local_128.
                 super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (((ulong)local_d8 & 1) != 0);
      for (; ppVar4 != ppVar5; ppVar4 = ppVar4 + 1) {
        local_d8 = (ppVar4->first).values_.elems[0];
        dStack_d0 = (ppVar4->first).values_.elems[1];
        local_108._0_8_ = (ppVar4->second).values_.elems[0];
        local_108._8_8_ = (ppVar4->second).values_.elems[1];
        std::__ostream_insert<char,std::char_traits<char>>(pbVar6,"<rect x = \"",0xb);
        poVar10 = std::ostream::_M_insert<double>((ppVar4->first).values_.elems[0]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" y = \"",7);
        poVar10 = std::ostream::_M_insert<double>((ppVar4->first).values_.elems[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" width = \"",0xb);
        dVar1 = (double)local_108._0_8_ - local_d8;
        dVar2 = (double)local_108._8_8_ - dStack_d0;
        local_108._8_4_ = SUB84(dVar2,0);
        local_108._0_8_ = dVar1;
        local_108._12_4_ = (int)((ulong)dVar2 >> 0x20);
        poVar10 = std::ostream::_M_insert<double>(dVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" height = \"",0xc);
        poVar10 = std::ostream::_M_insert<double>((double)local_108._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" stroke = \"",0xc);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,(local_90->_M_dataplus)._M_p,local_90->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" stroke-width = \"",0x12);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" fill = \"",10);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"/>\n",4);
      }
      if (local_128.
          super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_> *)0x0) {
        operator_delete(local_128.
                        super__Vector_base<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>,_std::allocator<std::pair<perior::point<double,_2UL>,_perior::point<double,_2UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      return pbVar6;
    }
  } while( true );
}

Assistant:

std::basic_ostream<charT, traits>&
to_svg(std::basic_ostream<charT, traits>&     os,
       const rectangle<pointT>&               box,
       const cubic_periodic_boundary<pointT>& b,
       const std::string&                     stroke       = "black",
       const std::size_t                      stroke_width = 1,
       const std::string&                     fill         = "none")
{
    BOOST_STATIC_ASSERT_MSG(
            ::perior::traits::dimension<pointT>::value == 2,
            "to_svg works only with 2-dimensional rectangle");

    // split box according to the boundary
    // here, use box
    std::vector<std::pair<pointT, pointT> > boxes; boxes.reserve(4);
    pointT lower = restrict_position(box.center - box.radius, b);
    pointT upper = restrict_position(box.center + box.radius, b);
    for(std::size_t i=0; i<2; ++i)
    {
        if(box.radius[i] >= b.half_width()[i])
        {
            lower[i] = b.lower()[i];
            upper[i] = b.upper()[i];
        }
    }

    boxes.push_back(std::make_pair(lower, upper));

    for(std::size_t dim=0; dim < 2; ++dim)
    {
        const std::size_t sz = boxes.size();
        for(std::size_t i=0; i<sz; ++i)
        {
            std::pair<pointT, pointT> bx = boxes.at(i);
            if(bx.first[dim] > bx.second[dim])
            {
                std::pair<pointT, pointT> splitted(bx);
                bx.first[dim]        = b.lower()[dim];
                splitted.second[dim] = b.upper()[dim];
                boxes.at(i) = bx;
                boxes.push_back(splitted);
            }
        }
    }

    for(typename std::vector<std::pair<pointT, pointT> >::const_iterator
            i(boxes.begin()), e(boxes.end()); i != e; ++i)
    {
        const pointT& xy = i->first;
        const pointT  rg = i->second - i->first;
        os << "<rect x = \""   << xy[0]  << "\" y = \""      << xy[1]
           << "\" width = \""  << rg[0]  << "\" height = \"" << rg[1]
           << "\" stroke = \"" << stroke << "\" stroke-width = \"" << stroke_width
           << "\" fill = \""   << fill   << "\"/>\n";
    }
    return os;
}